

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O2

void __thiscall
MemoryLeakOutputStringBuffer::reportMemoryLeak
          (MemoryLeakOutputStringBuffer *this,MemoryLeakDetectorNode *leak)

{
  uint uVar1;
  char *pcVar2;
  size_t sVar3;
  int iVar4;
  size_t sVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  sVar5 = this->total_leaks_;
  if (sVar5 == 0) {
    addMemoryLeakHeader(this);
    sVar5 = this->total_leaks_;
  }
  this->total_leaks_ = sVar5 + 1;
  uVar1 = leak->number_;
  sVar5 = leak->size_;
  pcVar2 = leak->file_;
  sVar3 = leak->line_;
  iVar4 = (*leak->allocator_->_vptr_TestMemoryAllocator[5])();
  SimpleStringBuffer::add
            (&this->outputBuffer_,
             "Alloc num (%u) Leak size: %lu Allocated at: %s and line: %d. Type: \"%s\"\n\tMemory: <%p> Content:\n"
             ,(ulong)uVar1,sVar5,pcVar2,(ulong)(uint)sVar3,CONCAT44(extraout_var,iVar4),
             leak->memory_);
  SimpleStringBuffer::addMemoryDump(&this->outputBuffer_,leak->memory_,leak->size_);
  iVar4 = (*leak->allocator_->_vptr_TestMemoryAllocator[5])();
  iVar4 = SimpleString::StrCmp((char *)CONCAT44(extraout_var_00,iVar4),"malloc");
  if (iVar4 == 0) {
    this->giveWarningOnUsingMalloc_ = true;
  }
  return;
}

Assistant:

void MemoryLeakOutputStringBuffer::reportMemoryLeak(MemoryLeakDetectorNode* leak)
{
    if (total_leaks_ == 0) {
        addMemoryLeakHeader();
    }

    total_leaks_++;
    outputBuffer_.add("Alloc num (%u) Leak size: %lu Allocated at: %s and line: %d. Type: \"%s\"\n\tMemory: <%p> Content:\n",
            leak->number_, (unsigned long) leak->size_, leak->file_, (int) leak->line_, leak->allocator_->alloc_name(), (void*) leak->memory_);
    outputBuffer_.addMemoryDump(leak->memory_, leak->size_);

    if (SimpleString::StrCmp(leak->allocator_->alloc_name(), (const char*) "malloc") == 0)
        giveWarningOnUsingMalloc_ = true;
}